

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v8::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,
               basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args,
               locale_ref loc)

{
  short *pend;
  undefined1 value [16];
  undefined1 value_00 [16];
  appender out;
  appender out_00;
  appender out_01;
  bool bVar1;
  type tVar2;
  short *end;
  short *psVar3;
  short *pbegin;
  size_t sVar4;
  size_t __n;
  appender it;
  appender out_02;
  char *message;
  basic_format_specs<char> specs;
  writer write;
  unkbyte10 in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff42;
  float local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  default_arg_formatter<char> local_a8;
  undefined1 local_88 [32];
  appender local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_58;
  locale_ref local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_a8.args.field_1 = args.field_1;
  local_a8.args.desc_ = args.desc_;
  sVar4 = fmt.size_;
  pbegin = (short *)fmt.data_;
  if ((sVar4 == 2) && (*pbegin == 0x7d7b)) {
    if ((long)local_a8.args.desc_ < 0) {
      if ((int)(type)args.desc_ < 1) {
        tVar2 = none_type;
      }
      else {
        sVar4 = ((local_a8.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a8.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a8.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar4;
        uStack_ae = (undefined6)(sVar4 >> 0x10);
        tVar2 = (local_a8.args.field_1.args_)->type_;
      }
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar4 = ((local_a8.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a8.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a8.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar4;
        uStack_ae = (undefined6)(sVar4 >> 0x10);
      }
    }
    if (tVar2 == none_type) {
      message = "argument not found";
LAB_001218c6:
      error_handler::on_error((error_handler *)local_88,message);
    }
    local_a8.out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)buf;
    local_a8.loc.locale_ = loc.locale_;
    switch(tVar2) {
    case int_type:
      out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = 0;
      out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = local_b8;
      write<char,_fmt::v8::appender,_int,_0>((detail *)buf,out_02,0x18b960);
      break;
    case uint_type:
      write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,(uint)local_b8);
      break;
    case long_long_type:
      out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = uStack_b4;
      out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = local_b8;
      write<char,_fmt::v8::appender,_long_long,_0>((detail *)buf,out_00,0x18b960);
      break;
    case ulong_long_type:
      write<char,_fmt::v8::appender,_unsigned_long_long,_0>
                ((appender)buf,CONCAT44(uStack_b4,local_b8));
      break;
    case int128_type:
      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = uStack_b4;
      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = local_b8;
      value._10_6_ = in_stack_ffffffffffffff42;
      value._0_10_ = in_stack_ffffffffffffff38;
      write<char,_fmt::v8::appender,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = uStack_b4;
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = local_b8;
      value_00._10_6_ = in_stack_ffffffffffffff42;
      value_00._0_10_ = in_stack_ffffffffffffff38;
      write<char,_fmt::v8::appender,_unsigned___int128,_0>
                ((detail *)buf,out_01,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()(&local_a8,(bool)(local_b8._0_1_ & 1));
      break;
    case char_type:
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar4 = buf->size_;
      buf->size_ = sVar4 + 1;
      buf->ptr_[sVar4] = local_b8._0_1_;
      break;
    case float_type:
      write<char,_fmt::v8::appender,_float,_0>((appender)buf,local_b8);
      break;
    case double_type:
      write<char,_fmt::v8::appender,_double,_0>((appender)buf,(double)CONCAT44(uStack_b4,local_b8));
      break;
    case last_numeric_type:
      specs.type = '\0';
      specs._9_2_ = 0;
      specs.fill.data_[0] = ' ';
      specs.fill.data_[1] = '\0';
      specs.fill.data_[2] = '\0';
      specs.fill.data_[3] = '\0';
      specs.fill.size_ = '\x01';
      specs.width = 0;
      specs.precision = -1;
      write<char,_fmt::v8::appender,_long_double,_0>
                ((appender)buf,(longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)),specs,
                 (locale_ref)0x0);
      break;
    case cstring_type:
      write<char,fmt::v8::appender>((appender)buf,(char *)CONCAT44(uStack_b4,local_b8));
      break;
    case string_type:
      copy_str_noinline<char,char_const*,fmt::v8::appender>
                ((char *)CONCAT44(uStack_b4,local_b8),
                 (char *)CONCAT44(uStack_b4,local_b8) + CONCAT62(uStack_ae,uStack_b0),(appender)buf)
      ;
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()(&local_a8,(void *)CONCAT44(uStack_b4,local_b8));
      break;
    case custom_type:
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_88._0_8_ = buf;
      local_88._8_8_ = local_a8.args.desc_;
      local_88._16_8_ = local_a8.args.field_1;
      local_88._24_8_ = loc.locale_;
      (*(code *)CONCAT62(uStack_ae,uStack_b0))(CONCAT44(uStack_b4,local_b8));
      break;
    default:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format.h"
                  ,0x7b2,"");
    }
  }
  else {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    pend = (short *)((long)pbegin + sVar4);
    local_88._8_8_ = pbegin;
    local_88._16_8_ = sVar4;
    local_68.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)buf;
    local_60 = (char *)local_a8.args.desc_;
    local_58 = local_a8.args.field_1;
    local_50.locale_ = loc.locale_;
    if ((long)sVar4 < 0x20) {
      if (sVar4 != 0) {
        psVar3 = pbegin;
        do {
          end = (short *)((long)psVar3 + 1);
          if ((char)*psVar3 == '}') {
            if ((end == pend) || (*(char *)end != '}')) {
              message = "unmatched \'}\' in format string";
              goto LAB_001218c6;
            }
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_88,(char *)pbegin,(char *)end);
            end = psVar3 + 1;
            pbegin = end;
          }
          else if ((char)*psVar3 == '{') {
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_88,(char *)pbegin,(char *)psVar3);
            end = (short *)parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                                     ((char *)psVar3,(char *)pend,(format_handler *)local_88);
            pbegin = end;
          }
          psVar3 = end;
        } while (end != pend);
      }
      vformat_to<char>::format_handler::on_text
                ((format_handler *)local_88,(char *)pbegin,(char *)pend);
    }
    else {
      local_a8.out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_88;
      do {
        if (pbegin == pend) {
          return;
        }
        psVar3 = pbegin;
        if ((char)*pbegin == '{') {
LAB_00121676:
          parse_format_string<false,_char,_format_handler>::writer::operator()
                    ((writer *)&local_a8,(char *)pbegin,(char *)psVar3);
          pbegin = (short *)parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                                      ((char *)psVar3,(char *)pend,(format_handler *)local_88);
          bVar1 = true;
        }
        else {
          __n = (long)pend - ((long)pbegin + 1);
          if ((long)__n < 0) {
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                        ,0x182,"negative value");
          }
          psVar3 = (short *)memchr((void *)((long)pbegin + 1),0x7b,__n);
          if (psVar3 != (short *)0x0) goto LAB_00121676;
          parse_format_string<false,_char,_format_handler>::writer::operator()
                    ((writer *)&local_a8,(char *)pbegin,(char *)pend);
          bVar1 = false;
        }
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}